

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grovepi.c
# Opt level: O0

mraa_pwm_context mraa_grovepi_pwm_init_internal_replace(void *func_table,int pin)

{
  mraa_pwm_context dev;
  int pin_local;
  void *func_table_local;
  
  func_table_local = calloc(1,0x20);
  if ((int *)func_table_local == (int *)0x0) {
    func_table_local = (void *)0x0;
  }
  else {
    *(int *)func_table_local = pin;
    *(int *)((long)func_table_local + 4) = 0x200;
    *(int *)((long)func_table_local + 0xc) = 0x1f4000;
    *(void **)((long)func_table_local + 0x18) = func_table;
  }
  return (mraa_pwm_context)func_table_local;
}

Assistant:

static mraa_pwm_context
mraa_grovepi_pwm_init_internal_replace(void* func_table, int pin)
{
    mraa_pwm_context dev = (mraa_pwm_context) calloc(1, sizeof(struct _pwm));
    if (dev == NULL) {
        return NULL;
    }
    dev->pin = pin;
    dev->chipid = 512;
    dev->period = 2048000; // Locked, in ns
    dev->advance_func = (mraa_adv_func_t*) func_table;

    return dev;
}